

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.hpp
# Opt level: O0

X86Mem __thiscall Centaurus::MyConstPool::add(MyConstPool *this,Data128 data)

{
  X86Mem XVar1;
  undefined4 local_a0;
  size_t offset;
  MyConstPool *this_local;
  Data128 data_local;
  uint32_t signature;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  size_t in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  ConstPool *in_stack_ffffffffffffffd0;
  
  asmjit::ConstPool::add
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             (size_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  this->m_as = (X86Assembler *)0xa;
  *(undefined4 *)((long)&(this->m_zone)._ptr + 4) = *(undefined4 *)(data.sq[0] + 0x10c);
  *(undefined4 *)&(this->m_zone)._ptr = local_a0;
  XVar1.super_Mem.super_Operand.super_Operand_.field_0._any.reserved8_4 = local_a0;
  XVar1.super_Mem.super_Operand.super_Operand_.field_0._packed[0] = (UInt64)this;
  XVar1.super_Mem.super_Operand.super_Operand_.field_0._any.reserved12_4 = 0;
  return (X86Mem)XVar1.super_Mem.super_Operand.super_Operand_.field_0;
}

Assistant:

asmjit::X86Mem add(asmjit::Data128 data)
    {
        size_t offset;
        m_pool.add(&data, 16, offset);

        return asmjit::X86Mem(m_label, offset);
    }